

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O2

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Base>
          (Structure *this,Base *dest,FileDatabase *db)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  element_type *this_00;
  int local_38;
  
  this_00 = (db->reader).
            super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar2 = (long)this_00->current - (long)this_00->buffer;
  lVar3 = lVar2;
  while( true ) {
    StreamReader<true,_true>::SetCurrentPos(this_00,(long)(int)lVar3);
    dest->prev = (Base *)0x0;
    ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>(this,&dest->object,"*object",db,false);
    bVar1 = ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Base>(this,&dest->next,"*next",db,true);
    if ((bVar1) ||
       (dest = (dest->next).super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, dest == (element_type *)0x0)) break;
    this_00 = (db->reader).
              super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    lVar3 = (long)this_00->current - (long)this_00->buffer;
  }
  local_38 = (int)lVar2;
  StreamReader<true,_true>::SetCurrentPos
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,(long)local_38 + this->size);
  return;
}

Assistant:

void Structure :: Convert<Base> (
    Base& dest,
    const FileDatabase& db
    ) const
{
    // note: as per https://github.com/assimp/assimp/issues/128,
    // reading the Object linked list recursively is prone to stack overflow.
    // This structure converter is therefore an hand-written exception that
    // does it iteratively.

    const int initial_pos = db.reader->GetCurrentPos();

    std::pair<Base*, int> todo = std::make_pair(&dest, initial_pos);
    for ( ;; ) {

        Base& cur_dest = *todo.first;
        db.reader->SetCurrentPos(todo.second);

        // we know that this is a double-linked, circular list which we never
        // traverse backwards, so don't bother resolving the back links.
        cur_dest.prev = NULL;

        ReadFieldPtr<ErrorPolicy_Warn>(cur_dest.object,"*object",db);

        // the return value of ReadFieldPtr indicates whether the object
        // was already cached. In this case, we don't need to resolve
        // it again.
        if(!ReadFieldPtr<ErrorPolicy_Warn>(cur_dest.next,"*next",db, true) && cur_dest.next) {
            todo = std::make_pair(&*cur_dest.next, db.reader->GetCurrentPos());
            continue;
        }
        break;
    }

    db.reader->SetCurrentPos(initial_pos + size);
}